

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

uint8_t reverse_byte(uint8_t b)

{
  uint8_t b_local;
  
  return (byte)((int)(b & 0x80) >> 7) | (byte)((int)(b & 0x40) >> 5) | (byte)((int)(b & 0x20) >> 3)
         | (byte)((int)(b & 0x10) >> 1) | (b & 8) << 1 | (b & 4) << 3 | (b & 2) << 5 | b << 7;
}

Assistant:

uint8_t reverse_byte(uint8_t b) {
    return (b & 0x80) >> 7 | (b & 0x40) >> 5 | (b & 0x20) >> 3 |
           (b & 0x10) >> 1 | (b & 0x08) << 1 | (b & 0x04) << 3 |
           (b & 0x02) << 5 | (b & 0x01) << 7;
}